

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gp3p::sPolynomial22
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xa30];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0x822];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x1f6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xa60] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0x8e2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x286] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xa90] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0x9d2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x826] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe20] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xc12] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x8e6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe50] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xcd2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x9d6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe80] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xdc2] / dVar2;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xe52];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa36] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe22] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa66] = -dVar3 / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa96] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe82] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xc16] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf40] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xcd6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf70] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xdc6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[4000] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xee2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe26] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf42] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe56] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf72] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe86] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfa2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xee6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfd0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xfa6] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfd2] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial22( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(22,10) = (groebnerMatrix(16,55)/(groebnerMatrix(16,54))-groebnerMatrix(18,47)/(groebnerMatrix(18,43)));
  groebnerMatrix(22,13) = (groebnerMatrix(16,56)/(groebnerMatrix(16,54))-groebnerMatrix(18,52)/(groebnerMatrix(18,43)));
  groebnerMatrix(22,43) = (groebnerMatrix(16,75)/(groebnerMatrix(16,54))-groebnerMatrix(18,64)/(groebnerMatrix(18,43)));
  groebnerMatrix(22,47) = (groebnerMatrix(16,76)/(groebnerMatrix(16,54))-groebnerMatrix(18,68)/(groebnerMatrix(18,43)));
  groebnerMatrix(22,52) = (groebnerMatrix(16,77)/(groebnerMatrix(16,54))-groebnerMatrix(18,73)/(groebnerMatrix(18,43)));
  groebnerMatrix(22,54) = -groebnerMatrix(18,75)/(groebnerMatrix(18,43));
  groebnerMatrix(22,55) = -groebnerMatrix(18,76)/(groebnerMatrix(18,43));
  groebnerMatrix(22,56) = -groebnerMatrix(18,77)/(groebnerMatrix(18,43));
  groebnerMatrix(22,64) = groebnerMatrix(16,81)/(groebnerMatrix(16,54));
  groebnerMatrix(22,68) = groebnerMatrix(16,82)/(groebnerMatrix(16,54));
  groebnerMatrix(22,73) = (groebnerMatrix(16,83)/(groebnerMatrix(16,54))-groebnerMatrix(18,79)/(groebnerMatrix(18,43)));
  groebnerMatrix(22,75) = -groebnerMatrix(18,81)/(groebnerMatrix(18,43));
  groebnerMatrix(22,76) = -groebnerMatrix(18,82)/(groebnerMatrix(18,43));
  groebnerMatrix(22,77) = -groebnerMatrix(18,83)/(groebnerMatrix(18,43));
  groebnerMatrix(22,79) = groebnerMatrix(16,84)/(groebnerMatrix(16,54));
  groebnerMatrix(22,83) = -groebnerMatrix(18,84)/(groebnerMatrix(18,43));
}